

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  undefined8 *puVar1;
  ImDrawList *pIVar2;
  ImGuiWindow *pIVar3;
  ImFont *font;
  char *text_begin;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  ImGuiContext *pIVar19;
  ImGuiWindow *pIVar20;
  ImVec2 *p_max;
  ImU32 IVar21;
  long lVar22;
  ImGuiWindow **ppIVar23;
  char *text_end;
  uint uVar24;
  ImGuiWindow **ppIVar25;
  undefined1 auVar26 [16];
  ImVec4 local_e8;
  ImGuiContext *local_d0;
  ImRect local_c8;
  ImRect local_b0;
  ImGuiWindow *local_a0;
  ImVec2 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  ImDrawList *local_50;
  ImGuiViewportP *local_48;
  ImVec2 *local_40;
  ImGuiWindow **local_38;
  
  pIVar19 = GImGui;
  local_a0 = GImGui->CurrentWindow;
  local_78 = bb->Min;
  uStack_70 = 0;
  _fStack_80 = 0;
  local_88._0_4_ = (bb->Max).x;
  local_88._4_4_ = (bb->Max).y;
  local_68 = (viewport->super_ImGuiViewport).Pos;
  uStack_60 = 0;
  local_98 = (viewport->super_ImGuiViewport).Size;
  uStack_90 = 0;
  pIVar2 = local_a0->DrawList;
  local_e8.x = (GImGui->Style).Colors[5].x;
  local_e8.y = (GImGui->Style).Colors[5].y;
  uVar7 = (GImGui->Style).Colors[5].z;
  uVar8 = (GImGui->Style).Colors[5].w;
  local_e8.w = (GImGui->Style).Alpha * 0.4 * (float)uVar8;
  local_e8.z = (float)uVar7;
  local_50 = draw_list;
  local_48 = viewport;
  IVar21 = ColorConvertFloat4ToU32(&local_e8);
  local_40 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar2,&bb->Min,&bb->Max,IVar21,0.0,0);
  pIVar20 = local_a0;
  local_d0 = pIVar19;
  lVar22 = (long)(pIVar19->Windows).Size;
  if (lVar22 != 0) {
    auVar26._0_4_ = (float)local_88._0_4_ - local_78.x;
    auVar26._4_4_ = (float)local_88._4_4_ - local_78.y;
    auVar26._8_4_ = fStack_80 - (float)uStack_70;
    auVar26._12_4_ = fStack_7c - uStack_70._4_4_;
    auVar18._8_8_ = uStack_90;
    auVar18._0_4_ = local_98.x;
    auVar18._4_4_ = local_98.y;
    _local_88 = divps(auVar26,auVar18);
    local_78.y = local_78.y - local_68.y * local_88._4_4_;
    local_78.x = local_78.x - local_68.x * local_88._0_4_;
    uStack_70 = CONCAT44(uStack_70._4_4_ - uStack_60._4_4_ * local_88._12_4_,
                         (float)uStack_70 - (float)uStack_60 * local_88._8_4_);
    ppIVar25 = (pIVar19->Windows).Data;
    ppIVar23 = ppIVar25 + lVar22;
    local_98 = (ImVec2)bb;
    local_38 = ppIVar23;
    do {
      pIVar3 = *ppIVar25;
      if ((pIVar3->WasActive == true) && ((pIVar3->Flags & 0x1000000) == 0)) {
        fVar4 = (pIVar3->Pos).x;
        fVar5 = (pIVar3->Pos).y;
        fVar6 = (pIVar3->Pos).y;
        local_b0.Min.x = (float)(int)(fVar4 * (float)local_88._0_4_ + local_78.x);
        local_b0.Min.y = (float)(int)(fVar5 * (float)local_88._4_4_ + local_78.y);
        local_b0.Max.x =
             (float)(int)(((pIVar3->Size).x + fVar4) * (float)local_88._0_4_ + local_78.x);
        local_b0.Max.y =
             (float)(int)(((pIVar3->Size).y + fVar5) * (float)local_88._4_4_ + local_78.y);
        local_c8.Min.x = (float)(int)((float)local_88._0_4_ * (pIVar3->Pos).x + local_78.x);
        local_c8.Min.y = (float)(int)((float)local_88._4_4_ * fVar6 + local_78.y);
        local_c8.Max.x =
             (float)(int)(((pIVar3->SizeFull).x + fVar4) * (float)local_88._0_4_ + local_78.x);
        local_c8.Max.y =
             (float)(int)((((pIVar3->TitleBarHeight + fVar5) - fVar6) * 3.0 + fVar6) *
                          (float)local_88._4_4_ + local_78.y);
        ImRect::ClipWithFull(&local_b0,bb);
        ImRect::ClipWithFull(&local_c8,bb);
        if (local_d0->NavWindow == (ImGuiWindow *)0x0) {
          uVar24 = 10;
        }
        else {
          uVar24 = pIVar3->RootWindowForTitleBarHighlight ==
                   local_d0->NavWindow->RootWindowForTitleBarHighlight | 10;
        }
        pIVar2 = pIVar20->DrawList;
        local_e8.x = (GImGui->Style).Colors[2].x;
        local_e8.y = (GImGui->Style).Colors[2].y;
        uVar9 = (GImGui->Style).Colors[2].z;
        uVar10 = (GImGui->Style).Colors[2].w;
        local_e8.w = (GImGui->Style).Alpha * (float)uVar10;
        local_e8.z = (float)uVar9;
        IVar21 = ColorConvertFloat4ToU32(&local_e8);
        ImDrawList::AddRectFilled(pIVar2,&local_b0.Min,&local_b0.Max,IVar21,0.0,0);
        pIVar2 = pIVar20->DrawList;
        puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar24 << 4));
        local_e8._0_8_ = *puVar1;
        uVar11 = puVar1[1];
        local_e8.w = (float)((ulong)uVar11 >> 0x20);
        local_e8.z = (float)uVar11;
        local_e8.w = (GImGui->Style).Alpha * local_e8.w;
        IVar21 = ColorConvertFloat4ToU32(&local_e8);
        ImDrawList::AddRectFilled(pIVar2,&local_c8.Min,&local_c8.Max,IVar21,0.0,0);
        pIVar2 = pIVar20->DrawList;
        local_e8.x = (GImGui->Style).Colors[5].x;
        local_e8.y = (GImGui->Style).Colors[5].y;
        uVar12 = (GImGui->Style).Colors[5].z;
        uVar13 = (GImGui->Style).Colors[5].w;
        local_e8.w = (GImGui->Style).Alpha * (float)uVar13;
        local_e8.z = (float)uVar12;
        IVar21 = ColorConvertFloat4ToU32(&local_e8);
        ImDrawList::AddRect(pIVar2,&local_b0.Min,&local_b0.Max,IVar21,0.0,0,1.0);
        pIVar2 = pIVar20->DrawList;
        font = local_d0->Font;
        local_68.x = local_d0->FontSize;
        local_e8.x = (GImGui->Style).Colors[0].x;
        local_e8.y = (GImGui->Style).Colors[0].y;
        uVar14 = (GImGui->Style).Colors[0].z;
        uVar15 = (GImGui->Style).Colors[0].w;
        local_e8.w = (GImGui->Style).Alpha * (float)uVar15;
        local_e8.z = (float)uVar14;
        IVar21 = ColorConvertFloat4ToU32(&local_e8);
        text_begin = pIVar3->Name;
        text_end = text_begin;
        if (text_begin != (char *)0xffffffffffffffff) {
          do {
            if (*text_end == '#') {
              if (text_end[1] == '#') goto LAB_00193558;
            }
            else if (*text_end == '\0') goto LAB_00193558;
            text_end = text_end + 1;
          } while (text_end != (char *)0xffffffffffffffff);
          text_end = (char *)0xffffffffffffffff;
        }
LAB_00193558:
        ImDrawList::AddText(pIVar2,font,local_68.x,&local_c8.Min,IVar21,text_begin,text_end,0.0,
                            (ImVec4 *)0x0);
        ppIVar23 = local_38;
        bb = (ImRect *)local_98;
      }
      ppIVar25 = ppIVar25 + 1;
    } while (ppIVar25 != ppIVar23);
  }
  local_e8.x = (GImGui->Style).Colors[5].x;
  local_e8.y = (GImGui->Style).Colors[5].y;
  uVar16 = (GImGui->Style).Colors[5].z;
  uVar17 = (GImGui->Style).Colors[5].w;
  local_e8.w = (GImGui->Style).Alpha * (float)uVar17;
  local_e8.z = (float)uVar16;
  IVar21 = ColorConvertFloat4ToU32(&local_e8);
  p_max = local_40;
  ImDrawList::AddRect(local_50,&bb->Min,local_40,IVar21,0.0,0,1.0);
  if ((local_48->super_ImGuiViewport).ID == (local_d0->DebugMetricsConfig).HighlightViewportID) {
    ImDrawList::AddRect(local_a0->DrawList,&bb->Min,p_max,0xff00ffff,0.0,0,1.0);
  }
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (ImGuiWindow* thumb_window : g.Windows)
    {
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImTrunc(off + thumb_r.Min * scale), ImTrunc(off +  thumb_r.Max * scale));
        title_r = ImRect(ImTrunc(off + title_r.Min * scale), ImTrunc(off +  ImVec2(title_r.Max.x, title_r.Min.y + title_r.GetHeight() * 3.0f) * scale)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
    if (viewport->ID == g.DebugMetricsConfig.HighlightViewportID)
        window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
}